

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O1

void glu::parseConfigBitsFromName(RenderConfig *config,char *renderCfgName)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  deBool dVar4;
  size_t sVar5;
  InternalError *this;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar9 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::colorCfgs[0].name + lVar9);
    dVar4 = deStringBeginsWith(renderCfgName,pcVar1);
    if (dVar4 != 0) {
      uVar2 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[0].redBits + lVar9);
      uVar3 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[0].blueBits + lVar9);
      config->redBits = (int)uVar2;
      config->greenBits = (int)((ulong)uVar2 >> 0x20);
      config->blueBits = (int)uVar3;
      config->alphaBits = (int)((ulong)uVar3 >> 0x20);
      sVar5 = strlen(pcVar1);
      renderCfgName = renderCfgName + sVar5;
      break;
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x78);
  lVar9 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::depthCfgs[0].name + lVar9);
    dVar4 = deStringBeginsWith(renderCfgName,pcVar1);
    if (dVar4 != 0) {
      config->depthBits = *(int *)((long)&parseConfigBitsFromName::depthCfgs[0].depthSize + lVar9);
      sVar5 = strlen(pcVar1);
      renderCfgName = renderCfgName + sVar5;
      break;
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  lVar9 = 8;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::depthCfgs[3].depthSize + lVar9);
    dVar4 = deStringBeginsWith(renderCfgName,pcVar1);
    if (dVar4 != 0) {
      config->stencilBits = *(int *)((long)&parseConfigBitsFromName::stencilCfgs[0].name + lVar9);
      sVar5 = strlen(pcVar1);
      renderCfgName = renderCfgName + sVar5;
      break;
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x38);
  lVar9 = 8;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::stencilCfgs[2].stencilSize + lVar9);
    dVar4 = deStringBeginsWith(renderCfgName,pcVar1);
    if (dVar4 != 0) {
      config->numSamples = *(int *)((long)&parseConfigBitsFromName::multiSampleCfgs[0].name + lVar9)
      ;
      sVar5 = strlen(pcVar1);
      renderCfgName = renderCfgName + sVar5;
      break;
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x68);
  if (*renderCfgName != '\0') {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Invalid GL configuration: \'","");
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    local_90 = (long *)*plVar6;
    plVar7 = plVar6 + 2;
    if (local_90 == plVar7) {
      local_80 = *plVar7;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70._M_dataplus._M_p = (pointer)*plVar6;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar6[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
    }
    local_70._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::InternalError::InternalError(this,&local_70);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void parseConfigBitsFromName (RenderConfig* config, const char* renderCfgName)
{
	const char*	cfgName	= renderCfgName;

	DE_ASSERT(config->redBits		== RenderConfig::DONT_CARE	&&
			  config->greenBits		== RenderConfig::DONT_CARE	&&
			  config->blueBits		== RenderConfig::DONT_CARE	&&
			  config->alphaBits		== RenderConfig::DONT_CARE	&&
			  config->depthBits		== RenderConfig::DONT_CARE	&&
			  config->stencilBits	== RenderConfig::DONT_CARE	&&
			  config->numSamples	== RenderConfig::DONT_CARE);

	static const struct
	{
		const char*	name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] =
	{
		{ "rgb888",		8, 8, 8, 0 },
		{ "rgba8888",	8, 8, 8, 8 },
		{ "rgb565",		5, 6, 5, 0 },
		{ "rgba4444",	4, 4, 4, 4 },
		{ "rgba5551",	5, 5, 5, 1 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, colorCfgs[ndx].name))
		{
			config->redBits		= colorCfgs[ndx].redBits;
			config->greenBits	= colorCfgs[ndx].greenBits;
			config->blueBits	= colorCfgs[ndx].blueBits;
			config->alphaBits	= colorCfgs[ndx].alphaBits;

			cfgName	+= strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			depthSize;
	} depthCfgs[] =
	{
		{ "d0",		0 },
		{ "d16",	16 },
		{ "d24",	24 },
		{ "d32",	32 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, depthCfgs[ndx].name))
		{
			config->depthBits = depthCfgs[ndx].depthSize;

			cfgName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			stencilSize;
	} stencilCfgs[] =
	{
		{ "s0",		 0 },
		{ "s8",		 8 },
		{ "s16",	16 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, stencilCfgs[ndx].name))
		{
			config->stencilBits = stencilCfgs[ndx].stencilSize;

			cfgName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			numSamples;
	} multiSampleCfgs[] =
	{
		{ "ms0",	 0 },
		{ "ms16",	16 },
		{ "ms1",	 1 },
		{ "ms2",	 2 },
		{ "ms4",	 4 },
		{ "ms8",	 8 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, multiSampleCfgs[ndx].name))
		{
			config->numSamples = multiSampleCfgs[ndx].numSamples;

			cfgName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	if (cfgName[0] != 0)
		throw tcu::InternalError(std::string("Invalid GL configuration: '") + renderCfgName + "'");
}